

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdNarrow<wabt::interp::Simd<signed_char,(unsigned_char)16>,wabt::interp::Simd<short,(unsigned_char)8>>
          (Thread *this)

{
  Simd<signed_char,_(unsigned_char)__x10_> value;
  char cVar1;
  short *psVar2;
  char *pcVar3;
  byte local_42;
  byte local_41;
  undefined1 auStack_40 [6];
  u8 i_1;
  u8 i;
  Simd<signed_char,_(unsigned_char)__x10_> result;
  Simd<short,_(unsigned_char)__b_> lhs;
  Simd<short,_(unsigned_char)__b_> rhs;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  for (local_41 = 0; local_41 < 8; local_41 = local_41 + 1) {
    psVar2 = Simd<short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<short,_(unsigned_char)__b_> *)(result.v + 8),local_41);
    cVar1 = Saturate<signed_char,short>(*psVar2);
    pcVar3 = Simd<signed_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<signed_char,_(unsigned_char)__x10_> *)auStack_40,local_41);
    *pcVar3 = cVar1;
  }
  for (local_42 = 0; local_42 < 8; local_42 = local_42 + 1) {
    psVar2 = Simd<short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<short,_(unsigned_char)__b_> *)(lhs.v + 4),local_42);
    cVar1 = Saturate<signed_char,short>(*psVar2);
    pcVar3 = Simd<signed_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<signed_char,_(unsigned_char)__x10_> *)auStack_40,local_42 + 8);
    *pcVar3 = cVar1;
  }
  value.v[8] = result.v[0];
  value.v[9] = result.v[1];
  value.v[10] = result.v[2];
  value.v[0xb] = result.v[3];
  value.v[0xc] = result.v[4];
  value.v[0xd] = result.v[5];
  value.v[0xe] = result.v[6];
  value.v[0xf] = result.v[7];
  value.v[0] = auStack_40[0];
  value.v[1] = auStack_40[1];
  value.v[2] = auStack_40[2];
  value.v[3] = auStack_40[3];
  value.v[4] = auStack_40[4];
  value.v[5] = auStack_40[5];
  value.v[6] = i_1;
  value.v[7] = i;
  Push<wabt::interp::Simd<signed_char,(unsigned_char)16>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdNarrow() {
  using SL = typename S::LaneType;
  using TL = typename T::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < T::lanes; ++i) {
    result[i] = Saturate<SL, TL>(lhs[i]);
  }
  for (u8 i = 0; i < T::lanes; ++i) {
    result[T::lanes + i] = Saturate<SL, TL>(rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}